

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLib.c
# Opt level: O0

JL_STATUS JlFreeJsonStringBuffer(char **pJsonStringBuffer)

{
  undefined4 local_14;
  JL_STATUS jlStatus;
  char **pJsonStringBuffer_local;
  
  if ((pJsonStringBuffer == (char **)0x0) || (*pJsonStringBuffer == (char *)0x0)) {
    local_14 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    WjTestLib_Free(*pJsonStringBuffer);
    *pJsonStringBuffer = (char *)0x0;
    local_14 = JL_STATUS_SUCCESS;
  }
  return local_14;
}

Assistant:

JL_STATUS
    JlFreeJsonStringBuffer
    (
        char**                  pJsonStringBuffer
    )
{
    JL_STATUS jlStatus;

    if(     NULL != pJsonStringBuffer
        &&  NULL != *pJsonStringBuffer )
    {
        JlFree( *pJsonStringBuffer );
        *pJsonStringBuffer = NULL;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}